

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (uchar *ldata,uchar *rdata,uchar *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  uchar uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uchar lentry_1;
  uchar lentry;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = *ldata;
      iVar4 = 0;
      do {
        result_data[iVar4] = uVar1 - rdata[iVar4];
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      uVar3 = puVar2[uVar7];
      uVar8 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar8 = count;
      }
      uVar5 = uVar8;
      if (uVar3 != 0) {
        uVar5 = uVar6;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar6 < uVar8) {
            uVar1 = *ldata;
            do {
              result_data[uVar5] = uVar1 - rdata[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
        }
        else if (uVar6 < uVar8) {
          uVar9 = 0;
          do {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              result_data[uVar6] = *ldata - rdata[uVar6];
            }
            uVar6 = uVar6 + 1;
            uVar9 = uVar9 + 1;
            uVar5 = uVar6;
          } while (uVar8 != uVar6);
        }
      }
      uVar7 = uVar7 + 1;
      uVar6 = uVar5;
    } while (uVar7 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}